

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fault_injection_test.cc
# Opt level: O0

anon_unknown_7 * __thiscall
leveldb::anon_unknown_7::GetDirName(anon_unknown_7 *this,string *filename)

{
  allocator local_21;
  long local_20;
  size_t found;
  string *filename_local;
  
  found = (size_t)filename;
  filename_local = (string *)this;
  local_20 = std::__cxx11::string::find_last_of((char *)filename,0x14b27d);
  if (local_20 == -1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    std::__cxx11::string::substr((ulong)this,found);
  }
  return this;
}

Assistant:

static std::string GetDirName(const std::string& filename) {
  size_t found = filename.find_last_of("/\\");
  if (found == std::string::npos) {
    return "";
  } else {
    return filename.substr(0, found);
  }
}